

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  char *pcVar2;
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar1 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    pcVar2 = getenv("DRY_RUN");
    if (pcVar2 == (char *)0x0) {
      glGetIntegerv(0xba2,0);
    }
    glfwDestroyWindow(handle);
    glfwTerminate();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
#ifdef _WIN32
    SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX | SEM_NOOPENFILEERRORBOX);
#endif

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    init();


    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}